

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrap_opkill.cpp
# Opt level: O1

Status __thiscall spvtools::opt::WrapOpKill::Process(WrapOpKill *this)

{
  IRContext *this_00;
  Module *pMVar1;
  bool bVar2;
  Function *this_01;
  Status SVar3;
  __node_base _Var4;
  bool modified;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  func_to_process;
  byte local_89;
  _Any_data local_88;
  code *local_78;
  code *pcStack_70;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_68;
  
  local_89 = 0;
  this_00 = (this->super_Pass).context_;
  if ((this_00->valid_analyses_ & kAnalysisStructuredCFG) == kAnalysisNone) {
    IRContext::BuildStructuredCFGAnalysis(this_00);
  }
  StructuredCFGAnalysis::FindFuncsCalledFromContinue
            ((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
              *)&local_68,
             (this_00->struct_cfg_analysis_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::StructuredCFGAnalysis,_std::default_delete<spvtools::opt::StructuredCFGAnalysis>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::StructuredCFGAnalysis_*,_std::default_delete<spvtools::opt::StructuredCFGAnalysis>_>
             .super__Head_base<0UL,_spvtools::opt::StructuredCFGAnalysis_*,_false>._M_head_impl);
  if (local_68._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
    _Var4._M_nxt = local_68._M_before_begin._M_nxt;
    do {
      this_01 = IRContext::GetFunction
                          ((this->super_Pass).context_,*(uint32_t *)&_Var4._M_nxt[1]._M_nxt);
      local_88._8_8_ = &local_89;
      pcStack_70 = std::
                   _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/wrap_opkill.cpp:29:43)>
                   ::_M_invoke;
      local_78 = std::
                 _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/wrap_opkill.cpp:29:43)>
                 ::_M_manager;
      local_88._M_unused._M_object = this;
      bVar2 = opt::Function::WhileEachInst
                        (this_01,(function<bool_(spvtools::opt::Instruction_*)> *)&local_88,false,
                         false);
      if (local_78 != (code *)0x0) {
        (*local_78)(&local_88,&local_88,__destroy_functor);
      }
      if (!bVar2) {
        SVar3 = Failure;
        goto LAB_0055efb6;
      }
      _Var4._M_nxt = (_Var4._M_nxt)->_M_nxt;
    } while (_Var4._M_nxt != (_Hash_node_base *)0x0);
  }
  if ((this->opkill_function_)._M_t.
      super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>.
      _M_t.
      super__Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
      .super__Head_base<0UL,_spvtools::opt::Function_*,_false>._M_head_impl != (Function *)0x0) {
    if (local_89 == 0) {
      __assert_fail("modified && \"The function should only be generated if something was modified.\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/wrap_opkill.cpp"
                    ,0x30,"virtual Pass::Status spvtools::opt::WrapOpKill::Process()");
    }
    pMVar1 = (((this->super_Pass).context_)->module_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
             .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
    local_88._M_unused._M_object =
         (this->opkill_function_)._M_t.
         super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
         ._M_t.
         super__Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
         .super__Head_base<0UL,_spvtools::opt::Function_*,_false>._M_head_impl;
    (this->opkill_function_)._M_t.
    super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>.
    _M_t.
    super__Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
    .super__Head_base<0UL,_spvtools::opt::Function_*,_false>._M_head_impl = (Function *)0x0;
    std::
    vector<std::unique_ptr<spvtools::opt::Function,std::default_delete<spvtools::opt::Function>>,std::allocator<std::unique_ptr<spvtools::opt::Function,std::default_delete<spvtools::opt::Function>>>>
    ::
    emplace_back<std::unique_ptr<spvtools::opt::Function,std::default_delete<spvtools::opt::Function>>>
              ((vector<std::unique_ptr<spvtools::opt::Function,std::default_delete<spvtools::opt::Function>>,std::allocator<std::unique_ptr<spvtools::opt::Function,std::default_delete<spvtools::opt::Function>>>>
                *)&pMVar1->functions_,
               (unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_> *
               )&local_88);
    std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>::
    ~unique_ptr((unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
                 *)&local_88);
  }
  if ((this->opterminateinvocation_function_)._M_t.
      super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>.
      _M_t.
      super__Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
      .super__Head_base<0UL,_spvtools::opt::Function_*,_false>._M_head_impl != (Function *)0x0) {
    if (local_89 == 0) {
      __assert_fail("modified && \"The function should only be generated if something was modified.\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/wrap_opkill.cpp"
                    ,0x35,"virtual Pass::Status spvtools::opt::WrapOpKill::Process()");
    }
    pMVar1 = (((this->super_Pass).context_)->module_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
             .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
    local_88._M_unused._M_object =
         (this->opterminateinvocation_function_)._M_t.
         super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
         ._M_t.
         super__Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
         .super__Head_base<0UL,_spvtools::opt::Function_*,_false>._M_head_impl;
    (this->opterminateinvocation_function_)._M_t.
    super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>.
    _M_t.
    super__Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
    .super__Head_base<0UL,_spvtools::opt::Function_*,_false>._M_head_impl = (Function *)0x0;
    std::
    vector<std::unique_ptr<spvtools::opt::Function,std::default_delete<spvtools::opt::Function>>,std::allocator<std::unique_ptr<spvtools::opt::Function,std::default_delete<spvtools::opt::Function>>>>
    ::
    emplace_back<std::unique_ptr<spvtools::opt::Function,std::default_delete<spvtools::opt::Function>>>
              ((vector<std::unique_ptr<spvtools::opt::Function,std::default_delete<spvtools::opt::Function>>,std::allocator<std::unique_ptr<spvtools::opt::Function,std::default_delete<spvtools::opt::Function>>>>
                *)&pMVar1->functions_,
               (unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_> *
               )&local_88);
    std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>::
    ~unique_ptr((unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
                 *)&local_88);
  }
  SVar3 = local_89 ^ SuccessWithoutChange;
LAB_0055efb6:
  std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_68);
  return SVar3;
}

Assistant:

Pass::Status WrapOpKill::Process() {
  bool modified = false;

  auto func_to_process =
      context()->GetStructuredCFGAnalysis()->FindFuncsCalledFromContinue();
  for (uint32_t func_id : func_to_process) {
    Function* func = context()->GetFunction(func_id);
    bool successful = func->WhileEachInst([this, &modified](Instruction* inst) {
      const auto opcode = inst->opcode();
      if ((opcode == spv::Op::OpKill) ||
          (opcode == spv::Op::OpTerminateInvocation)) {
        modified = true;
        if (!ReplaceWithFunctionCall(inst)) {
          return false;
        }
      }
      return true;
    });

    if (!successful) {
      return Status::Failure;
    }
  }

  if (opkill_function_ != nullptr) {
    assert(modified &&
           "The function should only be generated if something was modified.");
    context()->AddFunction(std::move(opkill_function_));
  }
  if (opterminateinvocation_function_ != nullptr) {
    assert(modified &&
           "The function should only be generated if something was modified.");
    context()->AddFunction(std::move(opterminateinvocation_function_));
  }
  return (modified ? Status::SuccessWithChange : Status::SuccessWithoutChange);
}